

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O3

_Bool expand_vec_cmp_noinv
                (TCGContext_conflict9 *tcg_ctx,TCGType_conflict type,uint vece,TCGv_vec v0,
                TCGv_vec v1,TCGv_vec v2,TCGCond cond)

{
  ulong *puVar1;
  ulong uVar2;
  TCGTemp *pTVar3;
  ulong uVar4;
  uintptr_t o_2;
  TCGv_vec pTVar5;
  uintptr_t o_3;
  uintptr_t o_4;
  TCGv_vec r;
  TCGv_vec pTVar6;
  TCGCond TVar7;
  byte bVar8;
  uintptr_t o_1;
  TCGv_vec r_00;
  bool bVar9;
  bool bVar10;
  _Bool local_40;
  
  bVar9 = true;
  pTVar5 = v1;
  switch(cond) {
  case TCG_COND_LT:
    cond = TCG_COND_GT;
    r = v1;
    pTVar5 = v2;
    goto LAB_00d042d2;
  case TCG_COND_GE:
    bVar8 = 3;
    goto LAB_00d0433c;
  case TCG_COND_LTU:
    bVar9 = 2 < vece;
    bVar8 = 0;
    if (bVar9) {
      bVar8 = 6;
    }
    bVar10 = !bVar9;
    break;
  case TCG_COND_GEU:
    bVar10 = vece < 3;
    bVar9 = !bVar10;
    bVar8 = bVar10 * '\t' + 7;
    bVar10 = !bVar10;
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
               ,0xdbb,(char *)0x0);
  case TCG_COND_EQ:
  case TCG_COND_GT:
    r = v2;
LAB_00d042d2:
    local_40 = false;
    goto LAB_00d04379;
  case TCG_COND_NE:
  case TCG_COND_LE:
    bVar8 = 0;
    goto LAB_00d0433c;
  case TCG_COND_LEU:
    bVar10 = vece < 3;
    bVar9 = !bVar10;
    bVar8 = bVar10 * '\x03' + 5;
    bVar10 = !bVar10;
    break;
  case TCG_COND_GTU:
    bVar10 = vece < 3;
    bVar9 = !bVar10;
    bVar8 = bVar10 * '\x05' + 4;
  }
  if (bVar10) {
LAB_00d0433c:
    cond = cond ^ TCG_COND_ALWAYS;
    local_40 = true;
  }
  else {
    local_40 = false;
  }
  pTVar6 = v2;
  if (((bVar8 & 2) != 0) &&
     (pTVar5 = v2, pTVar6 = v1, (cond & (TCG_COND_LTU|TCG_COND_LT)) != TCG_COND_NEVER)) {
    cond = cond ^ TCG_COND_NE;
  }
  if (bVar9) {
    r = pTVar6;
    if ((bVar8 & 4) == 0) {
LAB_00d04379:
      r_00 = (TCGv_vec)0x0;
      pTVar6 = (TCGv_vec)0x0;
      TVar7 = cond;
    }
    else {
      pTVar3 = tcg_temp_new_internal_tricore(tcg_ctx,type,false);
      r_00 = (TCGv_vec)((long)pTVar3 - (long)tcg_ctx);
      pTVar3 = tcg_temp_new_internal_tricore(tcg_ctx,type,false);
      r = (TCGv_vec)((long)pTVar3 - (long)tcg_ctx);
      tcg_gen_dupi_vec_tricore(tcg_ctx,vece,r,1L << ((char)(8 << ((byte)vece & 0x1f)) - 1U & 0x3f));
      tcg_gen_sub_vec_tricore(tcg_ctx,vece,r_00,pTVar5,r);
      tcg_gen_sub_vec_tricore(tcg_ctx,vece,r,pTVar6,r);
      pTVar6 = r;
      pTVar5 = r_00;
      TVar7 = cond ^ (TCG_COND_LTU|TCG_COND_LT);
      if ((cond & TCG_COND_LTU) == TCG_COND_NEVER) {
        TVar7 = cond;
      }
    }
  }
  else {
    pTVar3 = tcg_temp_new_internal_tricore(tcg_ctx,type,false);
    r = (TCGv_vec)((long)pTVar3 - (long)tcg_ctx);
    if ((bVar8 & 8) == 0) {
      tcg_gen_umax_vec_tricore(tcg_ctx,vece,r,pTVar5,pTVar6);
    }
    else {
      tcg_gen_umin_vec_tricore(tcg_ctx,vece,r,pTVar5,pTVar6);
    }
    r_00 = r;
    pTVar6 = (TCGv_vec)0x0;
    TVar7 = TCG_COND_EQ;
  }
  vec_gen_4_tricore(tcg_ctx,INDEX_op_cmp_vec,type,vece,(TCGArg)(v0 + (long)tcg_ctx),
                    (TCGArg)(pTVar5 + (long)tcg_ctx),(TCGArg)(r + (long)tcg_ctx),(ulong)TVar7);
  if (r_00 != (TCGv_vec)0x0) {
    uVar4 = ((long)(r_00 + -0x388) >> 3) * 0x6db6db6db6db6db7;
    uVar2 = *(ulong *)(r_00 + (long)&tcg_ctx->pool_cur);
    *(ulong *)(r_00 + (long)&tcg_ctx->pool_cur) = uVar2 & 0xffffff5fffffffff;
    puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                      (uVar4 >> 6) * 8 +
                      (ulong)((((uint)(uVar2 >> 0x26) & 1) * 5 + ((uint)(uVar2 >> 0x10) & 0xff)) *
                             0x40));
    *puVar1 = *puVar1 | 1L << ((byte)uVar4 & 0x3f);
    if (pTVar6 != (TCGv_vec)0x0) {
      uVar4 = ((long)(pTVar6 + -0x388) >> 3) * 0x6db6db6db6db6db7;
      uVar2 = *(ulong *)(pTVar6 + (long)&tcg_ctx->pool_cur);
      *(ulong *)(pTVar6 + (long)&tcg_ctx->pool_cur) = uVar2 & 0xffffff5fffffffff;
      puVar1 = (ulong *)((long)tcg_ctx->free_temps[0].l +
                        (uVar4 >> 6) * 8 +
                        (ulong)(((uint)((uVar2 & 0x4000000000) != 0) * 5 +
                                ((uint)(uVar2 >> 0x10) & 0xff)) * 0x40));
      *puVar1 = *puVar1 | 1L << ((byte)uVar4 & 0x3f);
    }
  }
  return local_40;
}

Assistant:

static bool expand_vec_cmp_noinv(TCGContext *tcg_ctx, TCGType type, unsigned vece, TCGv_vec v0,
                                 TCGv_vec v1, TCGv_vec v2, TCGCond cond)
{
    enum {
        NEED_INV  = 1,
        NEED_SWAP = 2,
        NEED_BIAS = 4,
        NEED_UMIN = 8,
        NEED_UMAX = 16,
    };
    TCGv_vec t1, t2;
    uint8_t fixup = 0;

    switch (cond) {
    case TCG_COND_EQ:
    case TCG_COND_GT:
        fixup = 0;
        break;
    case TCG_COND_NE:
    case TCG_COND_LE:
        fixup = NEED_INV;
        break;
    case TCG_COND_LT:
        fixup = NEED_SWAP;
        break;
    case TCG_COND_GE:
        fixup = NEED_SWAP | NEED_INV;
        break;
    case TCG_COND_LEU:
        if (vece <= MO_32) {
            fixup = NEED_UMIN;
        } else {
            fixup = NEED_BIAS | NEED_INV;
        }
        break;
    case TCG_COND_GTU:
        if (vece <= MO_32) {
            fixup = NEED_UMIN | NEED_INV;
        } else {
            fixup = NEED_BIAS;
        }
        break;
    case TCG_COND_GEU:
        if (vece <= MO_32) {
            fixup = NEED_UMAX;
        } else {
            fixup = NEED_BIAS | NEED_SWAP | NEED_INV;
        }
        break;
    case TCG_COND_LTU:
        if (vece <= MO_32) {
            fixup = NEED_UMAX | NEED_INV;
        } else {
            fixup = NEED_BIAS | NEED_SWAP;
        }
        break;
    default:
        g_assert_not_reached();
    }

    if (fixup & NEED_INV) {
        cond = tcg_invert_cond(cond);
    }
    if (fixup & NEED_SWAP) {
        t1 = v1, v1 = v2, v2 = t1;
        cond = tcg_swap_cond(cond);
    }

    t1 = t2 = NULL;
    if (fixup & (NEED_UMIN | NEED_UMAX)) {
        t1 = tcg_temp_new_vec(tcg_ctx, type);
        if (fixup & NEED_UMIN) {
            tcg_gen_umin_vec(tcg_ctx, vece, t1, v1, v2);
        } else {
            tcg_gen_umax_vec(tcg_ctx, vece, t1, v1, v2);
        }
        v2 = t1;
        cond = TCG_COND_EQ;
    } else if (fixup & NEED_BIAS) {
        t1 = tcg_temp_new_vec(tcg_ctx, type);
        t2 = tcg_temp_new_vec(tcg_ctx, type);
        tcg_gen_dupi_vec(tcg_ctx, vece, t2, 1ull << ((8 << vece) - 1));
        tcg_gen_sub_vec(tcg_ctx, vece, t1, v1, t2);
        tcg_gen_sub_vec(tcg_ctx, vece, t2, v2, t2);
        v1 = t1;
        v2 = t2;
        cond = tcg_signed_cond(cond);
    }

    tcg_debug_assert(cond == TCG_COND_EQ || cond == TCG_COND_GT);
    /* Expand directly; do not recurse.  */
    vec_gen_4(tcg_ctx, INDEX_op_cmp_vec, type, vece,
              tcgv_vec_arg(tcg_ctx, v0), tcgv_vec_arg(tcg_ctx, v1), tcgv_vec_arg(tcg_ctx, v2), cond);

    if (t1) {
        tcg_temp_free_vec(tcg_ctx, t1);
        if (t2) {
            tcg_temp_free_vec(tcg_ctx, t2);
        }
    }
    return fixup & NEED_INV;
}